

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

w_status wp_token_scan_binary_int(w_tokenizer *tokenizer,w_token_id *id)

{
  w_status wVar1;
  byte *pbVar2;
  uint32_t uVar3;
  ulong uVar4;
  byte bVar5;
  char *pcVar6;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe2);
  }
  pcVar6 = tokenizer->it;
  if (pcVar6 == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe3);
    pcVar6 = tokenizer->it;
  }
  if (pcVar6[-2] != '0') {
    w_handle_failed_assertion
              ("tokenizer->it[-2] == \'0\'","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe4);
    pcVar6 = tokenizer->it;
  }
  if (pcVar6[-1] != 'b') {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'b\'","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe5);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe6);
  }
  pbVar2 = (byte *)tokenizer->it;
  uVar4 = (ulong)*pbVar2;
  if (uVar4 < 0x32) {
    if ((0xac0100000401U >> (uVar4 & 0x3f) & 1) != 0) {
      pcVar6 = "unterminated binary integer literal";
      goto LAB_001073ef;
    }
    if ((0x3000000000000U >> (uVar4 & 0x3f) & 1) != 0) {
      tokenizer->it = (char *)(pbVar2 + 1);
      uVar3 = tokenizer->column;
      tokenizer->column = uVar3 + 1;
      bVar5 = pbVar2[1];
      if ((bVar5 & 0xfe) == 0x30) {
        uVar3 = uVar3 + 2;
        pbVar2 = pbVar2 + 2;
        do {
          tokenizer->it = (char *)pbVar2;
          tokenizer->column = uVar3;
          bVar5 = *pbVar2;
          uVar3 = uVar3 + 1;
          pbVar2 = pbVar2 + 1;
        } while ((bVar5 & 0xfe) == 0x30);
      }
      if ((bVar5 < 0x30) && ((0xac0100000401U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
        *id = W_TOKEN_ID_INT_BINARY;
        return W_SUCCESS;
      }
    }
  }
  pcVar6 = "not a valid binary integer literal character";
LAB_001073ef:
  wVar1 = wp_token_add_error(tokenizer,pcVar6);
  return wVar1;
}

Assistant:

static enum w_status
wp_token_scan_binary_int(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->it[-2] == '0');
    W_ASSERT(tokenizer->it[-1] == 'b');
    W_ASSERT(id != NULL);

    switch (*tokenizer->it)
    {
        case WP_TOKEN_CASE_BINARY_DIGITS:
        {
            wp_token_advance_iter(tokenizer);
            wp_token_consume_binary_digits(tokenizer);
            switch (*tokenizer->it)
            {
                case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
                {
                    *id = W_TOKEN_ID_INT_BINARY;
                    return W_SUCCESS;
                }
                default:
                {
                    return wp_token_add_error(
                        tokenizer,
                        WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                            "binary integer literal"
                        )
                    );
                }
            }
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_UNTERMINATED("binary integer literal")
            );
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR("binary integer literal")
            );
        }
    }
}